

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

void __thiscall rapic::client::decode(client *this,mssg *msg)

{
  ulong uVar1;
  uchar *puVar2;
  
  check_cur_type(this,mssg);
  std::__cxx11::string::reserve((ulong)msg);
  uVar1 = (this->rcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_;
  puVar2 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar1;
  if (this->capacity_ < this->cur_size_ + uVar1) {
    std::__cxx11::string::assign((char *)msg,(ulong)puVar2);
    std::__cxx11::string::append
              ((char *)msg,
               (ulong)(this->buffer_)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    return;
  }
  std::__cxx11::string::assign((char *)msg,(ulong)puVar2);
  return;
}

Assistant:

auto client::decode(mssg& msg) -> void
{
  check_cur_type(message_type::mssg);

  msg.content.reserve(cur_size_);

  // if the message spans the buffer wrap around point, copy it into a temporary location to ease parsing
  auto pos = rcount_ % capacity_;
  if (pos + cur_size_ > capacity_)
  {
    msg.content.assign(reinterpret_cast<char const*>(&buffer_[pos]), capacity_ - pos);
    msg.content.append(reinterpret_cast<char const*>(&buffer_[0]), cur_size_ - (capacity_ - pos));
  }
  else
  {
    msg.content.assign(reinterpret_cast<char const*>(&buffer_[pos]), cur_size_);
  }
}